

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O1

void __thiscall
htmlcxx2::HTML::ParserSax::parseTag<char_const*>(ParserSax *this,char *begin,char *pos)

{
  byte *pbVar1;
  byte *pbVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  byte *pbVar9;
  byte *pbVar10;
  char *pcVar11;
  size_t i;
  long lVar12;
  string name;
  string text;
  Node node;
  string local_168;
  char *local_148;
  char *local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  char *local_128;
  string local_120;
  string local_100;
  Node local_e0;
  
  pbVar1 = (byte *)(begin + 1);
  cVar3 = begin[1];
  pbVar2 = (byte *)(begin + 2);
  local_148 = begin;
  pbVar10 = pbVar1;
  pbVar9 = pbVar1;
  if (cVar3 == '/') {
    pbVar1 = pbVar2;
    pbVar10 = pbVar2;
    pbVar9 = pbVar2;
  }
  while ((pbVar1 != (byte *)pos && (iVar6 = isalnum((uint)*pbVar1), pbVar10 = pbVar1, iVar6 != 0)))
  {
    pbVar1 = pbVar1 + 1;
    pbVar10 = (byte *)pos;
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_140 = pos;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,pbVar9,pbVar10);
  if (cVar3 != '/') {
    local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p;
    lVar12 = 0;
    local_138 = local_168._M_string_length;
    do {
      if (local_168._M_string_length == (long)(char)(&impl::LITERAL_MODE_ELEM)[lVar12 * 0xb]) {
        pcVar11 = "script" + lVar12 * 0xb;
        paVar8 = local_130;
        local_128 = pcVar11;
        do {
          cVar4 = *pcVar11;
          if (paVar8->_M_local_buf[0] == '\0') {
            pos = (char *)(ulong)-(uint)(cVar4 != '\0');
            break;
          }
          if (cVar4 == '\0') {
            pos = (char *)0x1;
            break;
          }
          iVar6 = tolower((int)paVar8->_M_local_buf[0]);
          iVar7 = tolower((int)cVar4);
          if ((char)iVar6 < (char)iVar7) {
            pos = (char *)0xffffffff;
LAB_00157de9:
            bVar5 = false;
          }
          else {
            if ((char)iVar7 < (char)iVar6) {
              pos = (char *)0x1;
              goto LAB_00157de9;
            }
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar8->_M_local_buf + 1);
            pcVar11 = pcVar11 + 1;
            bVar5 = true;
          }
        } while (bVar5);
        local_168._M_string_length = local_138;
        if ((int)pos == 0) {
          this->literal_ = local_128;
          break;
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 5);
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,local_148,local_140);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
  Node::Node(&local_e0,&local_168,&local_100,&local_120,this->currentOffset_,
             local_100._M_string_length,NODE_TAG);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  this->currentOffset_ = this->currentOffset_ + local_e0.length_;
  (*this->_vptr_ParserSax[3])(this,&local_e0,(ulong)(cVar3 == '/'));
  Node::~Node(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ParserSax::parseTag(It begin, It pos)
{
    It name_begin(begin);
    ++name_begin;
    bool isClosingTag = (*name_begin == '/');
    if (isClosingTag)
        ++name_begin;
    It name_end(name_begin);
    while ((name_end != pos) && ::isalnum((unsigned char)*name_end))
        ++name_end;
    std::string name(name_begin, name_end);

    if (!isClosingTag)
    {
        const size_t arrCount = sizeof(impl::LITERAL_MODE_ELEM) /
                sizeof(impl::LITERAL_MODE_ELEM[0]);
        const size_t tagLen = name.length();
        for (size_t i = 0; i < arrCount; ++i)
            if ((tagLen == static_cast<size_t>(impl::LITERAL_MODE_ELEM[i][0]))
                    && (impl::icompare(name.c_str(), &impl::LITERAL_MODE_ELEM[i][1]) == 0))
                {
                    literal_ = &impl::LITERAL_MODE_ELEM[i][1];
                    break;
                }
    }

    //by now, length is just the size of the tag
    std::string text(begin, pos);
    Node node(name, text, "", currentOffset_, text.length(), Node::NODE_TAG);
    currentOffset_ += node.length();
    onFoundTag(node, isClosingTag);
}